

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgShader.cpp
# Opt level: O0

void __thiscall rsg::Shader::~Shader(Shader *this)

{
  Shader *this_local;
  
  anon_unknown_18::deleteVectorElements<rsg::Function>(&this->m_functions);
  anon_unknown_18::deleteVectorElements<rsg::Statement>(&this->m_globalStatements);
  anon_unknown_18::deleteVectorElements<rsg::ShaderInput>(&this->m_inputs);
  anon_unknown_18::deleteVectorElements<rsg::ShaderInput>(&this->m_uniforms);
  std::__cxx11::string::~string((string *)&this->m_source);
  Function::~Function(&this->m_mainFunction);
  std::vector<rsg::Function_*,_std::allocator<rsg::Function_*>_>::~vector(&this->m_functions);
  std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::~vector(&this->m_uniforms);
  std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::~vector(&this->m_inputs);
  std::vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>::~vector
            (&this->m_globalStatements);
  VariableScope::~VariableScope(&this->m_globalScope);
  return;
}

Assistant:

Shader::~Shader (void)
{
	deleteVectorElements(m_functions);
	deleteVectorElements(m_globalStatements);
	deleteVectorElements(m_inputs);
	deleteVectorElements(m_uniforms);
}